

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDataStack.h
# Opt level: O0

void __thiscall
HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
          (HighsDataStack *this,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *r)

{
  bool bVar1;
  size_type __new_size;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *this_00;
  char *pcVar2;
  Nonzero *__src;
  long lVar3;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t numData;
  size_t offset;
  
  __new_size = std::vector<char,_std::allocator<char>_>::size(in_RDI);
  this_00 = (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             *)std::
               vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
               ::size((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                       *)in_RSI);
  std::vector<char,_std::allocator<char>_>::resize(in_RSI,__new_size);
  bVar1 = std::
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          ::empty(this_00);
  if (!bVar1) {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x72d2b8);
    pcVar2 = pcVar2 + __new_size;
    __src = std::
            vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
            ::data((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                    *)0x72d2cc);
    memcpy(pcVar2,__src,(long)this_00 << 4);
  }
  lVar3 = (long)this_00 * 0x10 + __new_size;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x72d2ff);
  *(vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    **)(pcVar2 + lVar3) = this_00;
  return;
}

Assistant:

void push(const std::vector<T>& r) {
    std::size_t offset = data.size();
    std::size_t numData = r.size();
    // store the data
    data.resize(offset + numData * sizeof(T) + sizeof(std::size_t));
    if (!r.empty())
      std::memcpy(data.data() + offset, r.data(), numData * sizeof(T));
    // store the vector size
    offset += numData * sizeof(T);
    std::memcpy(data.data() + offset, &numData, sizeof(std::size_t));
  }